

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

Expression *
slang::ast::tryBindSpecialMethod
          (Compilation *compilation,Expression *expr,MemberSelector *selector,
          InvocationExpressionSyntax *invocation,ArrayOrRandomizeMethodExpressionSyntax *withClause,
          ASTContext *context)

{
  RandMode RVar1;
  ASTContext *in_RAX;
  Symbol *this;
  Expression *pEVar2;
  Compilation *compilation_00;
  long *plVar3;
  string_view methodName;
  
  this = Expression::getSymbolReference(expr,true);
  if (this == (Symbol *)0x0) {
LAB_0042944d:
    pEVar2 = (Expression *)0x0;
  }
  else {
    pEVar2 = (Expression *)(selector->name)._M_len;
    plVar3 = (long *)(selector->name)._M_str;
    if ((pEVar2 == (Expression *)0x9) && ((char)plVar3[1] == 'e' && *plVar3 == 0x646f6d5f646e6172))
    {
      RVar1 = Symbol::getRandMode(this);
      if (RVar1 == None) goto LAB_0042944d;
      pEVar2 = (Expression *)(selector->name)._M_len;
      plVar3 = (long *)(selector->name)._M_str;
      compilation_00 = (Compilation *)0x3f;
    }
    else {
      compilation_00 = (Compilation *)(ulong)this->kind;
    }
    methodName._M_str = (char *)invocation;
    methodName._M_len = (size_t)plVar3;
    pEVar2 = CallExpression::fromBuiltInMethod
                       ((CallExpression *)compilation,compilation_00,(SymbolKind)expr,pEVar2,
                        methodName,(InvocationExpressionSyntax *)withClause,
                        (ArrayOrRandomizeMethodExpressionSyntax *)context,in_RAX);
  }
  return pEVar2;
}

Assistant:

static Expression* tryBindSpecialMethod(Compilation& compilation, const Expression& expr,
                                        const LookupResult::MemberSelector& selector,
                                        const InvocationExpressionSyntax* invocation,
                                        const ArrayOrRandomizeMethodExpressionSyntax* withClause,
                                        const ASTContext& context) {
    auto sym = expr.getSymbolReference();
    if (!sym)
        return nullptr;

    // There is a built-in 'rand_mode' method that is present on every 'rand' and 'randc'
    // class property, and additionally on subelements of those properties.
    if (selector.name == "rand_mode"sv) {
        if (sym->getRandMode() == RandMode::None)
            return nullptr;

        return CallExpression::fromBuiltInMethod(compilation, SymbolKind::ClassProperty, expr,
                                                 selector.name, invocation, withClause, context);
    }

    return CallExpression::fromBuiltInMethod(compilation, sym->kind, expr, selector.name,
                                             invocation, withClause, context);
}